

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdRotate(Kit_DsdNtk_t *p,int *pFreqs)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  int iVar3;
  Kit_DsdObj_t *pKVar4;
  ushort uVar5;
  uint *puVar6;
  uint *pIn;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint *puVar13;
  ulong uVar14;
  uint *pOut;
  undefined1 auVar15 [16];
  int Weights [16];
  int aiStack_78 [18];
  
  uVar8 = (ulong)p->nNodes;
  if (p->nNodes != 0) {
    uVar14 = 0;
    do {
      pKVar4 = p->pNodes[uVar14];
      if (pKVar4 == (Kit_DsdObj_t *)0x0) {
        return;
      }
      KVar2 = *pKVar4;
      if ((((uint)KVar2 & 0x1c0) == 0x140) && (0x3ffffff < (uint)KVar2)) {
        uVar1 = p->nVars;
        uVar10 = 0;
        do {
          uVar5 = *(ushort *)((long)&pKVar4[1].field_0x0 + uVar10 * 2) >> 1;
          if ((int)uVar8 + (uint)uVar1 <= (uint)uVar5) {
            __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                          ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
          }
          iVar11 = 0;
          uVar12 = 0;
          if (p->pSupps != (uint *)0x0) {
            if (uVar5 < uVar1) {
              uVar12 = 1 << ((byte)uVar5 & 0x1f);
            }
            else {
              uVar12 = p->pSupps[(ulong)(uint)uVar5 - (ulong)uVar1];
            }
          }
          aiStack_78[uVar10] = 0;
          lVar7 = 0;
          do {
            if ((uVar12 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
              iVar11 = iVar11 + pFreqs[lVar7] + -1;
              aiStack_78[uVar10] = iVar11;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x10);
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)KVar2 >> 0x1a);
        if (0x3ffffff < (uint)KVar2) {
          uVar8 = 0;
          uVar10 = 0xffffffff;
          iVar11 = 0;
          do {
            iVar3 = aiStack_78[uVar8];
            iVar9 = iVar11;
            if (iVar11 <= iVar3) {
              iVar9 = iVar3;
            }
            if (iVar11 < iVar3) {
              uVar10 = uVar8 & 0xffffffff;
            }
            uVar8 = uVar8 + 1;
            iVar11 = iVar9;
          } while ((uint)KVar2 >> 0x1a != uVar8);
          iVar11 = (int)uVar10;
          if ((iVar11 != -1) && (0 < iVar11)) {
            puVar13 = (uint *)(&pKVar4->field_0x2 + uVar10 * 2);
            puVar6 = (uint *)((long)&pKVar4[1].field_0x0 + (ulong)((uint)KVar2 >> 8 & 0x3fc));
            pIn = p->pMem;
            do {
              pOut = pIn;
              pIn = puVar6;
              iVar11 = iVar11 + -1;
              auVar15 = pshuflw(ZEXT416(*puVar13),ZEXT416(*puVar13),0xe1);
              *puVar13 = auVar15._0_4_;
              Kit_TruthSwapAdjacentVars(pOut,pIn,(uint)*pKVar4 >> 0x1a,iVar11);
              puVar13 = (uint *)((long)puVar13 + -2);
              puVar6 = pOut;
            } while (iVar11 != 0);
            if ((uVar10 & 1) != 0) {
              uVar12 = 1 << ((SUB41(*pKVar4,3) >> 2) - 5 & 0x1f);
              if ((uint)*pKVar4 < 0x18000000) {
                uVar12 = 1;
              }
              if (0 < (int)uVar12) {
                uVar8 = (ulong)uVar12 + 1;
                do {
                  pIn[uVar8 - 2] = pOut[uVar8 - 2];
                  uVar8 = uVar8 - 1;
                } while (1 < uVar8);
              }
            }
          }
        }
      }
      uVar14 = uVar14 + 1;
      uVar8 = (ulong)p->nNodes;
    } while (uVar14 < uVar8);
  }
  return;
}

Assistant:

void Kit_DsdRotate( Kit_DsdNtk_t * p, int pFreqs[] )
{
    Kit_DsdObj_t * pObj;
    unsigned * pIn, * pOut, * pTemp, k;
    int i, v, Temp, uSuppFanin, iFaninLit, WeightMax, FaninMax, nSwaps;
    int Weights[16];
    // go through the prime nodes
    Kit_DsdNtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        // count the fanin frequencies
        Kit_DsdObjForEachFanin( p, pObj, iFaninLit, k )
        {
            uSuppFanin = Kit_DsdLitSupport( p, iFaninLit );
            Weights[k] = 0;
            for ( v = 0; v < 16; v++ )
                if ( uSuppFanin & (1 << v) )
                    Weights[k] += pFreqs[v] - 1;
        }
        // find the most frequent fanin
        WeightMax = 0; 
        FaninMax = -1;
        for ( k = 0; k < pObj->nFans; k++ )
            if ( WeightMax < Weights[k] )
            {
                WeightMax = Weights[k];
                FaninMax = k;
            }
        // no need to reorder if there are no frequent fanins
        if ( FaninMax == -1 )
            continue;
        // move the fanins number k to the first place
        nSwaps = 0;
        pIn = Kit_DsdObjTruth(pObj);
        pOut = p->pMem;
//        for ( v = FaninMax; v < ((int)pObj->nFans)-1; v++ )
        for ( v = FaninMax-1; v >= 0; v-- )
        {
            // swap the fanins
            Temp = pObj->pFans[v];
            pObj->pFans[v] = pObj->pFans[v+1];
            pObj->pFans[v+1] = Temp;
            // swap the truth table variables
            Kit_TruthSwapAdjacentVars( pOut, pIn, pObj->nFans, v );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
            nSwaps++;
        }
        if ( nSwaps & 1 )
            Kit_TruthCopy( pOut, pIn, pObj->nFans );
    }    
}